

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_OES_single_precision(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_OES_single_precision != 0) {
    glad_glClearDepthfOES = (PFNGLCLEARDEPTHFOESPROC)(*load)("glClearDepthfOES");
    glad_glClipPlanefOES = (PFNGLCLIPPLANEFOESPROC)(*load)("glClipPlanefOES");
    glad_glDepthRangefOES = (PFNGLDEPTHRANGEFOESPROC)(*load)("glDepthRangefOES");
    glad_glFrustumfOES = (PFNGLFRUSTUMFOESPROC)(*load)("glFrustumfOES");
    glad_glGetClipPlanefOES = (PFNGLGETCLIPPLANEFOESPROC)(*load)("glGetClipPlanefOES");
    glad_glOrthofOES = (PFNGLORTHOFOESPROC)(*load)("glOrthofOES");
  }
  return;
}

Assistant:

static void load_GL_OES_single_precision(GLADloadproc load) {
	if(!GLAD_GL_OES_single_precision) return;
	glad_glClearDepthfOES = (PFNGLCLEARDEPTHFOESPROC)load("glClearDepthfOES");
	glad_glClipPlanefOES = (PFNGLCLIPPLANEFOESPROC)load("glClipPlanefOES");
	glad_glDepthRangefOES = (PFNGLDEPTHRANGEFOESPROC)load("glDepthRangefOES");
	glad_glFrustumfOES = (PFNGLFRUSTUMFOESPROC)load("glFrustumfOES");
	glad_glGetClipPlanefOES = (PFNGLGETCLIPPLANEFOESPROC)load("glGetClipPlanefOES");
	glad_glOrthofOES = (PFNGLORTHOFOESPROC)load("glOrthofOES");
}